

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MDIOSimulationDataGenerator.cpp
# Opt level: O1

U32 __thiscall
MDIOSimulationDataGenerator::GenerateSimulationData
          (MDIOSimulationDataGenerator *this,U64 largest_sample_requested,U32 sample_rate,
          SimulationChannelDescriptor **simulation_channels)

{
  MdioOpCode opCode;
  char cVar1;
  U32 UVar2;
  ulong uVar3;
  ulong uVar4;
  SimulationChannelDescriptor *pSVar5;
  U8 regAddress;
  uint uVar6;
  U8 phyAddress;
  uint uVar7;
  U16 regAddress_00;
  
  uVar3 = AnalyzerHelpers::AdjustSimulationTargetSample
                    (largest_sample_requested,sample_rate,this->mSimulationSampleRateHz);
  uVar4 = SimulationChannelDescriptor::GetCurrentSampleNumber();
  if (uVar4 < uVar3) {
    uVar7 = (int)this + 0x18;
    phyAddress = '\0';
    uVar6 = 0;
    do {
      regAddress = (U8)uVar6;
      cVar1 = (char)((uVar6 & 0xff) * 0x25 >> 8);
      opCode = *(MdioOpCode *)
                (&DAT_00109440 + (ulong)(byte)(regAddress + (char)((uVar6 & 0xff) / 3) * -3) * 4);
      regAddress_00 = (U16)uVar6;
      CreateMdioC45Transaction
                (this,opCode,phyAddress,
                 *(MdioDevType *)
                  (&DAT_00109450 +
                  (ulong)(byte)(regAddress +
                               ((byte)(((byte)(regAddress - cVar1) >> 1) + cVar1) >> 2) * -7) * 4),
                 regAddress_00,regAddress_00);
      ClockGenerator::AdvanceByHalfPeriod(10.0);
      SimulationChannelDescriptorGroup::AdvanceAll(uVar7);
      CreateMdioC22Transaction(this,opCode,phyAddress + '\x01',regAddress,regAddress_00);
      ClockGenerator::AdvanceByHalfPeriod(20.0);
      SimulationChannelDescriptorGroup::AdvanceAll(uVar7);
      uVar4 = SimulationChannelDescriptor::GetCurrentSampleNumber();
      phyAddress = phyAddress + '\x02';
      uVar6 = uVar6 + 1;
    } while (uVar4 < uVar3);
  }
  pSVar5 = (SimulationChannelDescriptor *)SimulationChannelDescriptorGroup::GetArray();
  *simulation_channels = pSVar5;
  UVar2 = SimulationChannelDescriptorGroup::GetCount();
  return UVar2;
}

Assistant:

U32 MDIOSimulationDataGenerator::GenerateSimulationData( U64 largest_sample_requested, U32 sample_rate,
                                                         SimulationChannelDescriptor** simulation_channels )
{
    U64 adjusted_largest_sample_requested =
        AnalyzerHelpers::AdjustSimulationTargetSample( largest_sample_requested, sample_rate, mSimulationSampleRateHz );

    MdioOpCode opcodeValues[ 3 ] = { C45_WRITE, C22_READ, C45_READ }; // address
    U8 opIndex = 0;

    MdioDevType devTypeValues[ 7 ] = { DEV_RESERVED, DEV_PMD_PMA, DEV_WIS, DEV_PCS, DEV_PHY_XS, DEV_DTE_XS, DEV_OTHER };
    U8 devTypeIndex = 0;

    U16 regAddrValue = 0;
    U8 regAddrValue5b = 0;

    U16 dataValueC22 = 0;
    U16 dataValueC45 = 0;
    U8 phyAddressValue = 0;

    while( mMdc->GetCurrentSampleNumber() < adjusted_largest_sample_requested )
    {
        CreateMdioC45Transaction( opcodeValues[ opIndex % 3 ],         // OpCode
                                  phyAddressValue++,                   // PHY Address
                                  devTypeValues[ devTypeIndex++ % 7 ], // DevType
                                  regAddrValue++,                      // Register Address
                                  dataValueC45++                       // Data
        );

        mSimulationChannels.AdvanceAll( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) ); // insert 5 periods of idle

        CreateMdioC22Transaction( opcodeValues[ opIndex++ % 3 ], // OpCode
                                  phyAddressValue++,             // PHY Address
                                  regAddrValue5b++,              // Register Address
                                  dataValueC22++                 // Data
        );

        mSimulationChannels.AdvanceAll( mClockGenerator.AdvanceByHalfPeriod( 20.0 ) ); // insert 10 periods of idle
    }

    *simulation_channels = mSimulationChannels.GetArray();
    return mSimulationChannels.GetCount();
}